

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

VoidPromiseAndPipeline * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::startCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,RpcConnectionState *this,
          uint64_t interfaceId,uint64_t methodId,Own<capnp::ClientHook> *capability,
          Own<capnp::CallContextHook> *context)

{
  uint *puVar1;
  bool bVar2;
  Disposer *pDVar3;
  WirePointer *pWVar4;
  PromiseNode *pPVar5;
  Own<capnp::ClientHook> *pOVar6;
  undefined8 uVar7;
  int iVar8;
  TransformPromiseNodeBase *this_00;
  AttachmentPromiseNodeBase *this_01;
  undefined4 extraout_var;
  WirePointer *pWVar9;
  undefined8 *puVar10;
  anon_union_24_1_a8c68091_for_NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>_2
  *this_02;
  Own<capnp::PipelineHook> OVar11;
  MessageSizeCounts MVar12;
  CallContextHook *ptrCopy;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> promises;
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  request;
  ReaderFor<capnp::Persistent<>::SaveParams> params;
  Own<kj::_::PromiseNode> local_140;
  CallContextHook *local_130;
  Own<capnp::ClientHook> *local_128;
  undefined1 local_120 [16];
  WirePointer *pWStack_110;
  undefined1 local_108 [24];
  WirePointer *pWStack_f0;
  StructDataBitCount local_e8;
  StructPointerCount SStack_e4;
  undefined2 uStack_e2;
  int iStack_e0;
  undefined4 uStack_dc;
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  local_d8;
  undefined1 local_98 [12];
  undefined4 uStack_8c;
  WirePointer *pWStack_88;
  WirePointer *pWStack_80;
  StructDataBitCount local_78;
  StructPointerCount SStack_74;
  undefined2 uStack_72;
  int iStack_70;
  undefined4 uStack_6c;
  Disposer *local_68;
  uint64_t local_60;
  Own<capnp::CallContextHook> *local_58;
  uint64_t local_50;
  Maybe<capnp::MessageSize> local_48;
  
  if (interfaceId == 0xc8cb212fcd9f5691 && methodId == 0) {
    bVar2 = (this->gateway).ptr.isSet;
    this_02 = (anon_union_24_1_a8c68091_for_NullableValue<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>_2
               *)0x0;
    if (bVar2 != false) {
      this_02 = &(this->gateway).ptr.field_1;
    }
    if (bVar2 == true) {
      local_128 = capability;
      local_50 = methodId;
      (*capability->ptr->_vptr_ClientHook[3])(&local_d8);
      pOVar6 = local_128;
      local_98[0] = (char)local_d8.super_Builder._builder.segment;
      if ((char)local_d8.super_Builder._builder.segment == '\x01') {
        local_98._8_4_ = local_d8.super_Builder._builder.capTable._0_4_;
        uStack_8c = local_d8.super_Builder._builder.capTable._4_4_;
        pWStack_88 = (WirePointer *)local_d8.super_Builder._builder.data;
        local_d8.super_Builder._builder.data = (void *)0x0;
        pDVar3 = context->disposer;
        local_130 = context->ptr;
        context->ptr = (CallContextHook *)0x0;
        local_68 = pDVar3;
        this_00 = (TransformPromiseNodeBase *)operator_new(0x50);
        local_58 = context;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,(Own<kj::_::PromiseNode> *)(local_98 + 8),
                   kj::
                   CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>
                   ::operator());
        (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_006451e8;
        this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
        this_00[1].dependency.disposer = (Disposer *)interfaceId;
        this_00[1].dependency.ptr = (PromiseNode *)0x0;
        this_00[1].continuationTracePtr = pDVar3;
        this_00[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_130;
        local_140.disposer =
             (Disposer *)
             &kj::_::
              HeapDisposer<kj::_::TransformPromiseNode<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>,kj::Own<capnp::ClientHook>,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::{lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)#1},kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>>
              ::instance;
        puVar1 = &(this->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        pWVar9 = (WirePointer *)local_128->disposer;
        pWVar4 = (WirePointer *)local_128->ptr;
        local_128->ptr = (ClientHook *)0x0;
        local_140.ptr = (PromiseNode *)this_00;
        local_d8.super_Builder._builder.segment = (SegmentBuilder *)&this->super_Refcounted;
        local_d8.super_Builder._builder.capTable = (CapTableBuilder *)this;
        local_d8.super_Builder._builder.data = pWVar9;
        local_d8.super_Builder._builder.pointers = pWVar4;
        local_60 = interfaceId;
        this_01 = (AttachmentPromiseNodeBase *)operator_new(0x38);
        kj::_::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_01,&local_140);
        (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00645270;
        this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&this->super_Refcounted;
        this_01[1].dependency.disposer = (Disposer *)this;
        local_d8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
        this_01[1].dependency.ptr = (PromiseNode *)pWVar9;
        this_01[2].super_PromiseNode._vptr_PromiseNode = (_func_int **)pWVar4;
        local_120._0_8_ =
             &kj::_::
              HeapDisposer<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,kj::Own<capnp::ClientHook>>>>
              ::instance;
        local_120._8_8_ = this_01;
        kj::Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::split
                  ((SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>
                    *)local_108,
                   (Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *)
                   local_120);
        uVar7 = local_120._8_8_;
        if ((AttachmentPromiseNodeBase *)local_120._8_8_ != (AttachmentPromiseNodeBase *)0x0) {
          local_120._8_8_ = (AttachmentPromiseNodeBase *)0x0;
          (*(code *)((SegmentReader *)local_120._0_8_)->arena->_vptr_Arena)
                    (local_120._0_8_,
                     ((PromiseNode *)uVar7)->_vptr_PromiseNode[-2] +
                     (long)&((PromiseNode *)uVar7)->_vptr_PromiseNode);
        }
        pPVar5 = local_140.ptr;
        if ((TransformPromiseNodeBase *)local_140.ptr != (TransformPromiseNodeBase *)0x0) {
          local_140.ptr = (PromiseNode *)0x0;
          local_130 = (CallContextHook *)0x0;
          (**(local_140.disposer)->_vptr_Disposer)
                    (local_140.disposer,
                     ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                     (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
        }
        (__return_storage_ptr__->promise).super_PromiseBase.node.disposer =
             (Disposer *)local_108._0_8_;
        (__return_storage_ptr__->promise).super_PromiseBase.node.ptr =
             (PromiseNode *)local_108._8_8_;
        local_108._8_8_ = (CapTableReader *)0x0;
        OVar11 = newLocalPromisePipeline
                           ((capnp *)&__return_storage_ptr__->pipeline,
                            (Promise<kj::Own<capnp::PipelineHook>_> *)(local_108 + 0x10));
        pWVar9 = pWStack_f0;
        if (pWStack_f0 != (WirePointer *)0x0) {
          pWStack_f0 = (WirePointer *)0x0;
          (**(_func_int **)*(WirePointer *)local_108._16_8_)
                    (local_108._16_8_,
                     (_func_int *)
                     ((long)&(pWVar9->offsetAndKind).value +
                     (long)*(_func_int **)((long)*pWVar9 + -0x10)),OVar11.ptr);
        }
        uVar7 = local_108._8_8_;
        if ((CapTableReader *)local_108._8_8_ != (CapTableReader *)0x0) {
          local_108._8_8_ = (CapTableReader *)0x0;
          (*(code *)((SegmentReader *)local_108._0_8_)->arena->_vptr_Arena)
                    (local_108._0_8_,(*(_func_int ***)uVar7)[-2] + (long)(_func_int ***)uVar7);
        }
        pWVar9 = pWStack_88;
        if (local_98[0] != '\x01') {
          return __return_storage_ptr__;
        }
        if (pWStack_88 == (WirePointer *)0x0) {
          return __return_storage_ptr__;
        }
        pWStack_88 = (WirePointer *)0x0;
        puVar10 = (undefined8 *)CONCAT44(uStack_8c,local_98._8_4_);
      }
      else {
        iVar8 = (*local_128->ptr->_vptr_ClientHook[5])();
        if ((RpcConnectionState *)CONCAT44(extraout_var,iVar8) == this) {
          RpcClient::callNoIntercept
                    (__return_storage_ptr__,(RpcClient *)pOVar6->ptr,interfaceId,0,context);
          return __return_storage_ptr__;
        }
        (**context->ptr->_vptr_CallContextHook)(local_108);
        local_d8.super_Builder._builder.data = (void *)local_108._16_8_;
        local_d8.super_Builder._builder.pointers = pWStack_f0;
        local_d8.super_Builder._builder.segment = (SegmentBuilder *)local_108._0_8_;
        local_d8.super_Builder._builder.capTable = (CapTableBuilder *)local_108._8_8_;
        PointerReader::getStruct((StructReader *)local_98,(PointerReader *)&local_d8,(word *)0x0);
        MVar12 = StructReader::totalSize((StructReader *)local_98);
        local_48.ptr.field_1.value.capCount = MVar12.capCount + 1;
        local_48.ptr.field_1.value.wordCount = MVar12.wordCount + 2;
        local_48.ptr.isSet = true;
        RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
        Client::exportRequest(&local_d8,&this_02->value,&local_48);
        (*local_128->ptr->_vptr_ClientHook[4])(&local_140);
        local_120._8_8_ = local_140.disposer;
        pWStack_110 = (WirePointer *)local_140.ptr;
        local_140.ptr = (PromiseNode *)0x0;
        local_120._0_8_ = &Persistent<capnp::AnyPointer,capnp::AnyPointer>::Client::typeinfo;
        local_108._0_8_ = local_d8.super_Builder._builder.segment;
        local_108._8_8_ = local_d8.super_Builder._builder.capTable;
        local_108._16_8_ = local_d8.super_Builder._builder.pointers;
        PointerBuilder::setCapability
                  ((PointerBuilder *)local_108,(Own<capnp::ClientHook> *)(local_120 + 8));
        pWVar9 = pWStack_110;
        if (pWStack_110 != (WirePointer *)0x0) {
          pWStack_110 = (WirePointer *)0x0;
          (***(_func_int ***)local_120._8_8_)
                    (local_120._8_8_,
                     *(_func_int **)((long)*pWVar9 + -0x10) + (long)&pWVar9->offsetAndKind);
        }
        pPVar5 = local_140.ptr;
        if ((TransformPromiseNodeBase *)local_140.ptr != (TransformPromiseNodeBase *)0x0) {
          local_140.ptr = (PromiseNode *)0x0;
          (**(local_140.disposer)->_vptr_Disposer)
                    (local_140.disposer,
                     ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                     (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
        }
        local_108._0_8_ = CONCAT71(local_98._1_7_,local_98[0]);
        local_e8 = local_78;
        SStack_e4 = SStack_74;
        uStack_e2 = uStack_72;
        iStack_e0 = iStack_70;
        uStack_dc = uStack_6c;
        local_108._16_8_ = pWStack_88;
        pWStack_f0 = pWStack_80;
        pWStack_110 = local_d8.super_Builder._builder.pointers + 1;
        local_120._0_8_ = local_d8.super_Builder._builder.segment;
        local_120._8_8_ = local_d8.super_Builder._builder.capTable;
        PointerBuilder::setStruct((PointerBuilder *)local_120,(StructReader *)local_108,false);
        (*context->ptr->_vptr_CallContextHook[4])();
        (*context->ptr->_vptr_CallContextHook[1])();
        local_108._4_4_ = local_d8.hook.disposer._4_4_;
        local_108._0_4_ = local_d8.hook.disposer._0_4_;
        local_108._8_8_ = local_d8.hook.ptr;
        local_d8.hook.ptr = (RequestHook *)0x0;
        (*context->ptr->_vptr_CallContextHook[6])(__return_storage_ptr__);
        uVar7 = local_108._8_8_;
        if ((CapTableReader *)local_108._8_8_ != (CapTableReader *)0x0) {
          local_108._8_8_ = (CapTableReader *)0x0;
          (*(code *)((SegmentReader *)local_108._0_8_)->arena->_vptr_Arena)
                    (local_108._0_8_,(*(_func_int ***)uVar7)[-2] + (long)(_func_int ***)uVar7);
        }
        pWVar9 = (WirePointer *)local_d8.hook.ptr;
        if (local_d8.hook.ptr == (RequestHook *)0x0) {
          return __return_storage_ptr__;
        }
        local_d8.hook.ptr = (RequestHook *)0x0;
        puVar10 = (undefined8 *)CONCAT44(local_d8.hook.disposer._4_4_,local_d8.hook.disposer._0_4_);
      }
      (**(code **)*puVar10)
                (puVar10,((RequestHook *)pWVar9)->_vptr_RequestHook[-2] +
                         (long)&((RequestHook *)pWVar9)->_vptr_RequestHook);
      return __return_storage_ptr__;
    }
  }
  (*capability->ptr->_vptr_ClientHook[1])
            (__return_storage_ptr__,capability->ptr,interfaceId,methodId & 0xffff,context);
  return __return_storage_ptr__;
}

Assistant:

ClientHook::VoidPromiseAndPipeline startCall(
      uint64_t interfaceId, uint64_t methodId,
      kj::Own<ClientHook>&& capability, kj::Own<CallContextHook>&& context) {
    if (interfaceId == typeId<Persistent<>>() && methodId == 0) {
      KJ_IF_MAYBE(g, gateway) {
        // Wait, this is a call to Persistent.save() and we need to translate it through our
        // gateway.

        KJ_IF_MAYBE(resolvedPromise, capability->whenMoreResolved()) {
          // The plot thickens: We're looking at a promise capability. It could end up resolving
          // to a capability outside the gateway, in which case we don't want to translate at all.

          auto promises = resolvedPromise->then(kj::mvCapture(context,
              [this,interfaceId,methodId](kj::Own<CallContextHook>&& context,
                                          kj::Own<ClientHook> resolvedCap) {
            auto vpap = startCall(interfaceId, methodId, kj::mv(resolvedCap), kj::mv(context));
            return kj::tuple(kj::mv(vpap.promise), kj::mv(vpap.pipeline));
          })).attach(addRef(*this), kj::mv(capability)).split();

          return {
            kj::mv(kj::get<0>(promises)),
            newLocalPromisePipeline(kj::mv(kj::get<1>(promises))),
          };
        }

        if (capability->getBrand() == this) {
          // This capability is one of our own, pointing back out over the network. That means
          // that it would be inappropriate to apply the gateway transformation. We just want to
          // reflect the call back.
          return kj::downcast<RpcClient>(*capability)
              .callNoIntercept(interfaceId, methodId, kj::mv(context));
        }

        auto params = context->getParams().getAs<Persistent<>::SaveParams>();

        auto requestSize = params.totalSize();
        ++requestSize.capCount;
        requestSize.wordCount += sizeInWords<RealmGateway<>::ExportParams>();

        auto request = g->exportRequest(requestSize);
        request.setCap(Persistent<>::Client(capability->addRef()));
        request.setParams(params);

        context->allowCancellation();
        context->releaseParams();
        return context->directTailCall(RequestHook::from(kj::mv(request)));
      }
    }

    return capability->call(interfaceId, methodId, kj::mv(context));
  }